

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

Block * __thiscall
wasm::I64ToI32Lowering::makeLargeShl
          (I64ToI32Lowering *this,Index highBits,Index leftLow,Index shift)

{
  Builder *this_00;
  Expression *pEVar1;
  Expression *pEVar2;
  Binary *this_01;
  LocalSet *any;
  Const *append;
  Block *pBVar3;
  
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar1 = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x18,8);
  pEVar1->_id = LocalGetId;
  *(Index *)(pEVar1 + 1) = leftLow;
  (pEVar1->type).id = 2;
  pEVar2 = (Expression *)
           MixedArena::allocSpace
                     (&((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                       allocator,0x18,8);
  pEVar2->_id = LocalGetId;
  *(Index *)(pEVar2 + 1) = shift;
  (pEVar2->type).id = 2;
  this_01 = (Binary *)MixedArena::allocSpace(&this_00->wasm->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = ShlInt32;
  this_01->left = pEVar1;
  this_01->right = pEVar2;
  Binary::finalize(this_01);
  any = Builder::makeLocalSet(this_00,highBits,(Expression *)this_01);
  append = Builder::makeConst<int>
                     ((this->builder)._M_t.
                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t
                      .super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0);
  pBVar3 = Builder::blockify(this_00,(Expression *)any,(Expression *)append);
  return pBVar3;
}

Assistant:

Block* makeLargeShl(Index highBits, Index leftLow, Index shift) {
    return builder->blockify(
      builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShlInt32,
                            builder->makeLocalGet(leftLow, Type::i32),
                            builder->makeLocalGet(shift, Type::i32))),
      builder->makeConst(int32_t(0)));
  }